

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AndEvaluationTest.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  double extraout_XMM0_Qa;
  double __val;
  double __val_00;
  double extraout_XMM0_Qa_00;
  double __val_01;
  double extraout_XMM0_Qa_01;
  double __val_02;
  Variable x;
  Variable y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Variable local_f0;
  string local_d8;
  Variable local_b8;
  Expression local_a0;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Kandinsky::Variable::Variable(&local_f0);
  Kandinsky::Variable::Variable(&local_b8);
  (local_f0.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       3.0;
  (local_b8.m_variableExpressionPtr.
   super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_value =
       0.0;
  Kandinsky::operator&&<Kandinsky::Variable,_Kandinsky::Variable,_nullptr>
            (&local_a0,&local_f0,&local_b8);
  (**(local_a0.m_baseExpressionPtr.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_BaseExpression)();
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_d8,__val);
  std::operator+(&local_130,&local_d8," && ");
  (**((local_b8.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_88,__val_00);
  std::operator+(&local_110,&local_130,&local_88);
  std::operator+(&local_28,&local_110," != 0");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa == 0.0) & 1),&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_d8);
  Kandinsky::Expression::~Expression(&local_a0);
  local_d8._M_dataplus._M_p._0_4_ = 1;
  Kandinsky::operator&&<Kandinsky::Variable,_int,_nullptr>
            ((Expression *)&local_130,&local_f0,(int *)&local_d8);
  (*(code *)**(undefined8 **)local_130._M_string_length)();
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_110,__val_01);
  std::operator+(&local_48,&local_110," && 1 != 1");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_00 == 1.0) & 1),&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_110);
  Kandinsky::Expression::~Expression((Expression *)&local_130);
  local_88._M_dataplus._M_p._0_4_ = 1;
  Kandinsky::operator&&<int,_Kandinsky::Variable,_nullptr>
            ((Expression *)&local_d8,(int *)&local_88,&local_f0);
  (*(code *)**(undefined8 **)local_d8._M_string_length)();
  (**((local_f0.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_BaseExpression)._vptr_BaseExpression)();
  std::__cxx11::to_string(&local_130,__val_02);
  std::operator+(&local_110,"1 && ",&local_130);
  std::operator+(&local_68,&local_110," != 1");
  Kandinsky::assertOrExit((bool)(-(extraout_XMM0_Qa_01 == 1.0) & 1),&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  Kandinsky::Expression::~Expression((Expression *)&local_d8);
  Kandinsky::Variable::~Variable(&local_b8);
  Kandinsky::Variable::~Variable(&local_f0);
  return 0;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    Variable y;
    x.setValue(3);
    y.setValue(0);
    assertOrExit((x && y).evaluate() == 0, std::to_string(x.evaluate()) + " && " + std::to_string(y.evaluate()) + " != 0");
    assertOrExit((x && 1).evaluate() == 1, std::to_string(x.evaluate()) + " && 1 != 1");
    assertOrExit((1 && x).evaluate() == 1, "1 && " + std::to_string(x.evaluate()) + " != 1");
    return 0;
}